

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O0

void SoPlex_getRowVectorReal(void *soplex,int i,int *nnonzeros,long *indices,double *coefs)

{
  int iVar1;
  double *pdVar2;
  long in_RCX;
  int __c;
  int *in_RDX;
  long in_R8;
  int j;
  DSVector row;
  SoPlex *so;
  DSVectorBase<double> *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint local_60;
  SVectorBase<double> local_48 [2];
  long local_28;
  long local_20;
  int *local_18;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  ::soplex::DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             iVar1);
  ::soplex::SoPlexBase<double>::getRowVectorReal
            ((SoPlexBase<double> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             iVar1,in_stack_ffffffffffffff80);
  iVar1 = ::soplex::SVectorBase<double>::size(local_48);
  *local_18 = iVar1;
  for (local_60 = 0; (int)local_60 < *local_18; local_60 = local_60 + 1) {
    pdVar2 = ::soplex::SVectorBase<double>::value(local_48,local_60);
    *(double *)(local_28 + (long)(int)local_60 * 8) = *pdVar2;
    in_stack_ffffffffffffff80 =
         (DSVectorBase<double> *)
         ::soplex::SVectorBase<double>::index(local_48,(char *)(ulong)local_60,__c);
    *(long *)(local_20 + (long)(int)local_60 * 8) =
         (long)*(int *)&in_stack_ffffffffffffff80->_vptr_DSVectorBase;
  }
  ::soplex::DSVectorBase<double>::~DSVectorBase(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void SoPlex_getRowVectorReal(void* soplex, int i, int* nnonzeros, long* indices, double* coefs)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector row;

   so->getRowVectorReal(i, row);

   *nnonzeros = row.size();

   for(int j = 0; j < *nnonzeros; ++j)
   {
      coefs[j] = row.value(j);
      indices[j] = row.index(j);
   }
}